

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClosedFileInputSource.cc
# Opt level: O3

void __thiscall
ClosedFileInputSource::ClosedFileInputSource(ClosedFileInputSource *this,char *filename)

{
  allocator<char> local_9;
  
  (this->super_InputSource).last_offset = 0;
  (this->super_InputSource).buf_len = 0;
  (this->super_InputSource).buf_idx = 0;
  (this->super_InputSource).buf_start = 0;
  (this->super_InputSource)._vptr_InputSource = (_func_int **)&PTR__ClosedFileInputSource_002efbf8;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->filename,filename,&local_9);
  *(undefined8 *)
   ((long)&(this->fis).super___shared_ptr<FileInputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1) =
       0;
  *(undefined8 *)
   ((long)&(this->fis).super___shared_ptr<FileInputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi + 1) = 0;
  this->offset = 0;
  (this->fis).super___shared_ptr<FileInputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  return;
}

Assistant:

ClosedFileInputSource::ClosedFileInputSource(char const* filename) :
    filename(filename),
    offset(0),
    stay_open(false)
{
}